

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,string *str)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::ByteData((ByteData *)&local_30,(uint8_t *)(str->_M_dataplus)._M_p,
                     (uint32_t)str->_M_string_length);
  ByteData::Push(&this->buffer_,(ByteData *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const std::string &str) {
  buffer_.Push(ByteData(
      reinterpret_cast<const uint8_t *>(str.data()),
      static_cast<uint32_t>(str.size())));
  return *this;
}